

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space_factory.h
# Opt level: O0

size_type __thiscall
projects::dpg::ProductUniformFESpaceFactory<double>::AddFluxComponent
          (ProductUniformFESpaceFactory<double> *this,size_type degree)

{
  size_type sVar1;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_90;
  RefElType local_79;
  undefined1 local_78 [32];
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_58;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_48 [2];
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_28;
  size_type local_14;
  ProductUniformFESpaceFactory<double> *pPStack_10;
  size_type degree_local;
  ProductUniformFESpaceFactory<double> *this_local;
  
  local_14 = degree;
  pPStack_10 = this;
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (&local_28,(nullptr_t)0x0);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::push_back(&this->rfs_tria_v_,&local_28);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_28);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (local_48,(nullptr_t)0x0);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::push_back(&this->rfs_quad_v_,local_48);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(local_48);
  local_79 = (RefElType)lf::base::RefEl::kSegment();
  ReferenceFiniteElement
            ((ProductUniformFESpaceFactory<double> *)local_78,(RefEl)(RefElType)this,(uint)local_79)
  ;
  std::
  make_shared<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>,std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>
            ((shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)(local_78 + 0x10));
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_58,
             (shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_> *)
             (local_78 + 0x10));
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::push_back(&this->rfs_segment_v_,(value_type *)&local_58);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_58);
  std::shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_>::~shared_ptr
            ((shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_> *)
             (local_78 + 0x10));
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr
            ((shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)local_78);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (&local_90,(nullptr_t)0x0);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::push_back(&this->rfs_point_v_,&local_90);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_90);
  sVar1 = this->num_components_;
  this->num_components_ = sVar1 + 1;
  return sVar1;
}

Assistant:

size_type ProductUniformFESpaceFactory<SCALAR>::AddFluxComponent(
    size_type degree) {
  // add discontinuous shape functions to segments
  rfs_tria_v_.push_back(nullptr);
  rfs_quad_v_.push_back(nullptr);
  rfs_segment_v_.push_back(
      std::make_shared<DiscontinuousScalarReferenceFiniteElement<SCALAR>>(
          ReferenceFiniteElement(lf::base::RefEl::kSegment(), degree)));
  rfs_point_v_.push_back(nullptr);
  return num_components_++;
}